

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int exported_names_cmp(void *p1,void *p2,void *opaque)

{
  int iVar1;
  JSValue v;
  JSValue v_00;
  
  v = JS_AtomToString((JSContext *)opaque,*p1);
  v_00 = JS_AtomToString((JSContext *)opaque,*p2);
  iVar1 = 0;
  if ((int)v_00.tag != 6 && (int)v.tag != 6) {
    iVar1 = js_string_compare((JSContext *)v.u.ptr,(JSString *)v_00.u.ptr,(JSString *)v_00.tag);
  }
  JS_FreeValue((JSContext *)opaque,v);
  JS_FreeValue((JSContext *)opaque,v_00);
  return iVar1;
}

Assistant:

static int exported_names_cmp(const void *p1, const void *p2, void *opaque)
{
    JSContext *ctx = opaque;
    const ExportedNameEntry *me1 = p1;
    const ExportedNameEntry *me2 = p2;
    JSValue str1, str2;
    int ret;

    /* XXX: should avoid allocation memory in atom comparison */
    str1 = JS_AtomToString(ctx, me1->export_name);
    str2 = JS_AtomToString(ctx, me2->export_name);
    if (JS_IsException(str1) || JS_IsException(str2)) {
        /* XXX: raise an error ? */
        ret = 0;
    } else {
        ret = js_string_compare(ctx, JS_VALUE_GET_STRING(str1),
                                JS_VALUE_GET_STRING(str2));
    }
    JS_FreeValue(ctx, str1);
    JS_FreeValue(ctx, str2);
    return ret;
}